

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_30::AsyncStreamFd::whenWriteDisconnected(AsyncStreamFd *this)

{
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar2;
  Promise<void> result;
  ForkedPromise<void> fork;
  undefined1 local_38 [8];
  PromiseNode *pPStack_30;
  Own<kj::_::ForkHub<kj::_::Void>_> local_28;
  PromiseNode *pPVar1;
  
  if (*(char *)(in_RSI + 0x78) == '\x01') {
    PVar2 = ForkedPromise<void>::addBranch((ForkedPromise<void> *)this);
    pPVar1 = PVar2.super_PromiseBase.node.ptr;
  }
  else {
    UnixEventPort::FdObserver::whenWriteDisconnected((FdObserver *)local_38);
    Promise<void>::fork((Promise<void> *)&local_28);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_38);
    _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_38);
    _::NullableValue<kj::ForkedPromise<void>>::emplace<kj::ForkedPromise<void>>
              ((NullableValue<kj::ForkedPromise<void>> *)(in_RSI + 0x78),
               (ForkedPromise<void> *)&local_28);
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)local_38;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
    _vptr_AsyncOutputStream = (_func_int **)pPStack_30;
    pPStack_30 = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_38);
    Own<kj::_::ForkHub<kj::_::Void>_>::dispose(&local_28);
    pPVar1 = extraout_RDX;
  }
  PVar2.super_PromiseBase.node.ptr = pPVar1;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    KJ_IF_MAYBE(p, writeDisconnectedPromise) {
      return p->addBranch();
    } else {
      auto fork = observer.whenWriteDisconnected().fork();
      auto result = fork.addBranch();
      writeDisconnectedPromise = kj::mv(fork);
      return kj::mv(result);
    }